

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::replace_illegal_names
          (CompilerGLSL *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  SPIRVariable *var;
  Meta *pMVar4;
  const_iterator cVar5;
  SPIRFunction *pSVar6;
  SPIRType *pSVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Decoration *memb;
  Decoration *__k;
  long lVar10;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  LoopLock loop_lock;
  LoopLock local_68;
  ParsedIR *local_60;
  string local_58;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  local_60 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_60);
  sVar1 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar11 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar10 = 0;
    do {
      uVar8 = (ulong)*(uint *)((long)&pTVar11->id + lVar10);
      pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 * 3);
      if (pVVar2[uVar8].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar8);
        bVar3 = Compiler::is_hidden_variable(&this->super_Compiler,var,false);
        if (!bVar3) {
          pMVar4 = ParsedIR::find_meta(local_60,(ID)(var->super_IVariant).self.id);
          if (pMVar4 != (Meta *)0x0) {
            cVar5 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&keywords->_M_h,(key_type *)pMVar4);
            if (cVar5.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              join<char_const(&)[2],std::__cxx11::string&>
                        (&local_58,(spirv_cross *)0x2c1f55,(char (*) [2])pMVar4,pbVar9);
              ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p);
              }
            }
          }
        }
      }
      lVar10 = lVar10 + 4;
    } while (sVar1 << 2 != lVar10);
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  ParsedIR::create_loop_hard_lock(local_60);
  sVar1 = (this->super_Compiler).ir.ids_for_type[4].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar11 = (this->super_Compiler).ir.ids_for_type[4].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar10 = 0;
    do {
      uVar8 = (ulong)*(uint *)((long)&pTVar11->id + lVar10);
      pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 * 3);
      if (pVVar2[uVar8].type == TypeFunction) {
        pSVar6 = Variant::get<spirv_cross::SPIRFunction>(pVVar2 + uVar8);
        pMVar4 = ParsedIR::find_meta(local_60,(ID)(pSVar6->super_IVariant).self.id);
        if (pMVar4 != (Meta *)0x0) {
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&keywords->_M_h,(key_type *)pMVar4);
          if (cVar5.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_58,(spirv_cross *)0x2c1f55,(char (*) [2])pMVar4,pbVar9);
            ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
      }
      lVar10 = lVar10 + 4;
    } while (sVar1 << 2 != lVar10);
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  ParsedIR::create_loop_hard_lock(local_60);
  sVar1 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar11 = (this->super_Compiler).ir.ids_for_type[1].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_38 = pTVar11 + sVar1;
    do {
      uVar8 = (ulong)pTVar11->id;
      pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 * 3);
      if (pVVar2[uVar8].type == TypeType) {
        pSVar7 = Variant::get<spirv_cross::SPIRType>(pVVar2 + uVar8);
        pMVar4 = ParsedIR::find_meta(local_60,(ID)(pSVar7->super_IVariant).self.id);
        if (pMVar4 != (Meta *)0x0) {
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&keywords->_M_h,(key_type *)pMVar4);
          if (cVar5.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_58,(spirv_cross *)0x2c1f55,(char (*) [2])pMVar4,pbVar9);
            ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
          sVar1 = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          if (sVar1 != 0) {
            __k = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar10 = sVar1 * 0x188;
            do {
              cVar5 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&keywords->_M_h,&__k->alias);
              if (cVar5.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                join<char_const(&)[2],std::__cxx11::string&>
                          (&local_58,(spirv_cross *)0x2c1f55,(char (*) [2])__k,pbVar9);
                ::std::__cxx11::string::operator=((string *)__k,(string *)&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p);
                }
              }
              __k = __k + 1;
              lVar10 = lVar10 + -0x188;
            } while (lVar10 != 0);
          }
        }
      }
      pTVar11 = pTVar11 + 1;
    } while (pTVar11 != local_38);
  }
  ParsedIR::LoopLock::~LoopLock(&local_68);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names(const unordered_set<string> &keywords)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (is_hidden_variable(var))
			return;

		auto *meta = ir.find_meta(var.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, const SPIRFunction &func) {
		auto *meta = ir.find_meta(func.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		auto *meta = ir.find_meta(type.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);

		for (auto &memb : meta->members)
			if (keywords.find(memb.alias) != end(keywords))
				memb.alias = join("_", memb.alias);
	});
}